

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jas_icc.c
# Opt level: O0

jas_iccattrtab_t * jas_iccattrtab_create(void)

{
  int iVar1;
  jas_iccattrtab_t *tab_00;
  jas_iccattrtab_t *tab;
  
  tab_00 = (jas_iccattrtab_t *)jas_malloc(0x10);
  if (tab_00 != (jas_iccattrtab_t *)0x0) {
    tab_00->maxattrs = 0;
    tab_00->numattrs = 0;
    tab_00->attrs = (jas_iccattr_t *)0x0;
    iVar1 = jas_iccattrtab_resize(tab_00,0x20);
    if (iVar1 == 0) {
      return tab_00;
    }
  }
  if (tab_00 != (jas_iccattrtab_t *)0x0) {
    jas_iccattrtab_destroy(tab_00);
  }
  return (jas_iccattrtab_t *)0x0;
}

Assistant:

static jas_iccattrtab_t *jas_iccattrtab_create()
{
	jas_iccattrtab_t *tab;
	tab = 0;
	if (!(tab = jas_malloc(sizeof(jas_iccattrtab_t))))
		goto error;
	tab->maxattrs = 0;
	tab->numattrs = 0;
	tab->attrs = 0;
	if (jas_iccattrtab_resize(tab, 32))
		goto error;
	return tab;
error:
	if (tab)
		jas_iccattrtab_destroy(tab);
	return 0;
}